

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
::increment_slow(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
                 *this)

{
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  bVar1;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar2;
  undefined8 uVar3;
  bool bVar4;
  byte i;
  uint uVar5;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
  *pbVar7;
  char *__function;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>
  save;
  int iStack_20;
  
  pbVar7 = this->node_;
  if (((ulong)pbVar7 & 7) == 0) {
    uVar5 = this->position_;
    if (pbVar7[0xb] ==
        (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
         )0x0) {
      if ((int)(uint)(byte)pbVar7[10] <= (int)uVar5) {
        __assert_fail("position_ < node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x85e,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>, const google::protobuf::FileDescriptor *const &, const google::protobuf::FileDescriptor *const *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>, Reference = const google::protobuf::FileDescriptor *const &, Pointer = const google::protobuf::FileDescriptor *const *]"
                     );
      }
      i = (char)uVar5 + 1;
      while( true ) {
        pbVar7 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                 ::child(pbVar7,i);
        this->node_ = pbVar7;
        if (((ulong)pbVar7 & 7) != 0) break;
        bVar1 = pbVar7[0xb];
        i = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
            ::start(pbVar7);
        if (bVar1 != (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                      )0x0) {
          this->position_ = (uint)i;
          return;
        }
      }
    }
    else {
      if ((int)uVar5 < (int)(uint)(byte)pbVar7[10]) {
        __assert_fail("position_ >= node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x852,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>, const google::protobuf::FileDescriptor *const &, const google::protobuf::FileDescriptor *const *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>, Reference = const google::protobuf::FileDescriptor *const &, Pointer = const google::protobuf::FileDescriptor *const *]"
                     );
      }
      pbVar2 = this->node_;
      uVar3 = *(undefined8 *)&this->position_;
      do {
        if (uVar5 != (byte)pbVar7[10]) {
LAB_001da9aa:
          if (((ulong)pbVar7 & 7) == 0) {
            if (this->position_ != (uint)(byte)pbVar7[10]) {
              return;
            }
            iStack_20 = (int)uVar3;
            this->position_ = iStack_20;
            this->node_ = pbVar2;
            return;
          }
          break;
        }
        bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                ::is_root(pbVar7);
        pbVar7 = this->node_;
        if (bVar4) goto LAB_001da9aa;
        if (((ulong)pbVar7 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 0UL, Char = const char]"
          ;
          goto LAB_001daa40;
        }
        pbVar6 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                 ::child(*(btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                           **)pbVar7,(field_type)pbVar7[8]);
        pbVar7 = this->node_;
        if (pbVar6 != pbVar7) {
          __assert_fail("node_->parent()->child(node_->position()) == node_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                        ,0x855,
                        "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>, const google::protobuf::FileDescriptor *const &, const google::protobuf::FileDescriptor *const *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>>, Reference = const google::protobuf::FileDescriptor *const &, Pointer = const google::protobuf::FileDescriptor *const *]"
                       );
        }
        if (((ulong)pbVar6 & 7) != 0) break;
        uVar5 = (uint)(byte)pbVar7[8];
        this->position_ = uVar5;
        pbVar7 = *(btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>
                   **)pbVar7;
        this->node_ = pbVar7;
      } while (((ulong)pbVar7 & 7) == 0);
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FileDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FileDescriptor *, google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare, std::allocator<const google::protobuf::FileDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
  ;
LAB_001daa40:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

void btree_iterator<N, R, P>::increment_slow() {
  if (node_->is_leaf()) {
    assert(position_ >= node_->finish());
    btree_iterator save(*this);
    while (position_ == node_->finish() && !node_->is_root()) {
      assert(node_->parent()->child(node_->position()) == node_);
      position_ = node_->position();
      node_ = node_->parent();
    }
    // TODO(ezb): assert we aren't incrementing end() instead of handling.
    if (position_ == node_->finish()) {
      *this = save;
    }
  } else {
    assert(position_ < node_->finish());
    node_ = node_->child(static_cast<field_type>(position_ + 1));
    while (node_->is_internal()) {
      node_ = node_->start_child();
    }
    position_ = node_->start();
  }
}